

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

string * __thiscall
deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(string *__return_storage_ptr__,DrawTestSpec *this)

{
  pointer pAVar1;
  string *psVar2;
  ostream *poVar3;
  InputType type;
  OutputType type_00;
  Storage storage;
  InputType type_01;
  OutputType type_02;
  IndexType type_03;
  Storage storage_00;
  IndexType type_04;
  Storage storage_01;
  IndexType type_05;
  Storage storage_02;
  IndexType type_06;
  Storage storage_03;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  long lStack_230;
  string local_220;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream desc;
  ostream local_1a8 [376];
  
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&desc);
  lVar4 = 0x25;
  for (uVar6 = 0; psVar2 = local_1e0,
      pAVar1 = (this->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->attribs).
                             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x28);
      uVar6 = uVar6 + 1) {
    if (*(char *)((long)pAVar1 + lVar4 + -1) == '\x01') {
      poVar3 = std::operator<<(local_1a8,"Attribute ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": default, ");
      pcVar5 = "color ,";
      if ((*(byte *)((long)&pAVar1->inputType + lVar4) & 1) != 0) {
        pcVar5 = "position ,";
      }
      if (uVar6 == 0) {
        pcVar5 = "position ,";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"input datatype ");
      inputTypeToString_abi_cxx11_
                (&local_200,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x25),type);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"input component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0x15));
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"used as ");
      outputTypeToString_abi_cxx11_
                (&local_220,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x21),type_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      std::operator<<(poVar3,", ");
    }
    else {
      poVar3 = std::operator<<(local_1a8,"Attribute ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": ");
      pcVar5 = "color ,";
      if ((*(byte *)((long)&pAVar1->inputType + lVar4) & 1) != 0) {
        pcVar5 = "position ,";
      }
      if (uVar6 == 0) {
        pcVar5 = "position ,";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"Storage in ");
      storageToString_abi_cxx11_
                (&local_200,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x1d),storage);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"stride ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0xd));
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"input datatype ");
      inputTypeToString_abi_cxx11_
                (&local_220,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x25),type_01);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"input component count ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -0x15));
      poVar3 = std::operator<<(poVar3,", ");
      pcVar5 = gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1;
      if (*(char *)((long)pAVar1 + lVar4 + -9) != '\0') {
        pcVar5 = "normalized, ";
      }
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,"used as ");
      outputTypeToString_abi_cxx11_
                (&local_1d8,(DrawTestSpec *)(ulong)*(uint *)((long)pAVar1 + lVar4 + -0x21),type_02);
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"instance divisor ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar1 + lVar4 + -5));
      std::operator<<(poVar3,", ");
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    lVar4 = lVar4 + 0x28;
  }
  lStack_230 = 0x28;
  switch(this->drawMethod) {
  case DRAWMETHOD_DRAWARRAYS:
    poVar3 = std::operator<<(local_1a8,"drawArrays(), ");
    poVar3 = std::operator<<(poVar3,"first ");
    lStack_230 = 0x1c;
    goto LAB_006d9966;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    poVar3 = std::operator<<(local_1a8,"drawArraysInstanced(), ");
    poVar3 = std::operator<<(poVar3,"first ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"instance count ");
    goto LAB_006d9966;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    poVar3 = std::operator<<(local_1a8,"drawArraysIndirect(), ");
    poVar3 = std::operator<<(poVar3,"first ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"instance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"indirect offset ");
    lStack_230 = 0x2c;
LAB_006d9966:
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,*(int *)((long)&(this->apiType).m_bits + lStack_230));
    std::operator<<(poVar3,", ");
    goto switchD_006d9683_default;
  case DRAWMETHOD_DRAWELEMENTS:
    poVar3 = std::operator<<(local_1a8,"drawElements(), ");
    poVar3 = std::operator<<(poVar3,"index type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_04);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::operator<<(poVar3,", ");
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    poVar3 = std::operator<<(local_1a8,"drawElementsRanged(), ");
    poVar3 = std::operator<<(poVar3,"index type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"range start ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"range end ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::operator<<(poVar3,", ");
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    poVar3 = std::operator<<(local_1a8,"drawElementsInstanced(), ");
    poVar3 = std::operator<<(poVar3,"index type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_05);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"instance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::operator<<(poVar3,", ");
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    poVar3 = std::operator<<(local_1a8,"drawElementsIndirect(), ");
    poVar3 = std::operator<<(poVar3,"index type ");
    indexTypeToString_abi_cxx11_(&local_200,(DrawTestSpec *)(ulong)this->indexType,type_06);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index storage in ");
    storageToString_abi_cxx11_(&local_220,(DrawTestSpec *)(ulong)this->indexStorage,storage_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"index offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"instance count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"indirect offset ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"base vertex ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::operator<<(poVar3,", ");
    break;
  default:
    goto switchD_006d9683_default;
  }
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
switchD_006d9683_default:
  std::ostream::operator<<(local_1a8,this->primitiveCount);
  if ((ulong)this->primitive < 0xb) {
    std::operator<<(local_1a8,*(char **)(&DAT_00a30100 + (ulong)this->primitive * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&desc);
  return psVar2;
}

Assistant:

std::string DrawTestSpec::getDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attrib.useDefaultAttribute)
		{
			desc
				<< "Attribute " << ndx << ": default, " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position ,") : ("color ,"))
				<< "input datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << ", "
				<< "input component count " << attrib.componentCount << ", "
				<< "used as " << DrawTestSpec::outputTypeToString(attrib.outputType) << ", ";
		}
		else
		{
			desc
				<< "Attribute " << ndx << ": " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position ,") : ("color ,"))
				<< "Storage in " << DrawTestSpec::storageToString(attrib.storage) << ", "
				<< "stride " << attrib.stride << ", "
				<< "input datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << ", "
				<< "input component count " << attrib.componentCount << ", "
				<< (attrib.normalize ? "normalized, " : "")
				<< "used as " << DrawTestSpec::outputTypeToString(attrib.outputType) << ", "
				<< "instance divisor " << attrib.instanceDivisor << ", ";
		}
	}

	if (drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		desc
			<< "drawArrays(), "
			<< "first " << first << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		desc
			<< "drawArraysInstanced(), "
			<< "first " << first << ", "
			<< "instance count " << instanceCount << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		desc
			<< "drawElements(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		desc
			<< "drawElementsRanged(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "range start " << indexMin << ", "
			<< "range end " << indexMax << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		desc
			<< "drawElementsInstanced(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "instance count " << instanceCount << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		desc
			<< "drawArraysIndirect(), "
			<< "first " << first << ", "
			<< "instance count " << instanceCount << ", "
			<< "indirect offset " << indirectOffset << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		desc
			<< "drawElementsIndirect(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "instance count " << instanceCount << ", "
			<< "indirect offset " << indirectOffset << ", "
			<< "base vertex " << baseVertex << ", ";
	}
	else
		DE_ASSERT(DE_FALSE);

	desc << primitiveCount;

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			desc << "points";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			desc << "triangles";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			desc << "triangles (fan)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			desc << "triangles (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			desc << "lines";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			desc << "lines (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			desc << "lines (loop)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			desc << "lines (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			desc << "lines (strip, adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			desc << "triangles (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			desc << "triangles (strip, adjancency)";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	return desc.str();
}